

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32_t tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  ushort uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  Limit limit;
  CppStringType CVar5;
  int iVar6;
  UnknownFieldSet *pUVar7;
  Message *pMVar8;
  EnumDescriptor *this;
  EnumValueDescriptor *value_00;
  Reflection *this_00;
  uint64_t value_01;
  char *in_R9;
  string *value_02;
  Metadata MVar9;
  string_view field_name;
  string_view field_name_00;
  double value;
  uint32_t length;
  anon_union_16_2_39e9c77e_for_Rep_0 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Limit local_b8;
  uint32_t local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  MVar9 = Message::GetMetadata(message);
  this_00 = MVar9.reflection;
  if (field == (FieldDescriptor *)0x0) {
LAB_0022d212:
    pUVar7 = Reflection::MutableUnknownFields(this_00,message);
    bVar3 = SkipField(input,tag,pUVar7);
    return bVar3;
  }
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)field->type_ * 4)) {
    bVar3 = FieldDescriptor::is_packable(field);
    if ((tag & 7) == 2 && bVar3) {
      bVar3 = io::CodedInputStream::ReadVarint32(input,&local_b4);
      if (!bVar3) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_b4);
      switch(field->type_) {
      case '\x01':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                            (input,(double *)&local_d8);
          if (!bVar3) {
            return false;
          }
          Reflection::AddDouble(this_00,message,field,(double)local_d8.as_tree.cordz_info);
        }
        break;
      case '\x02':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                            (input,(float *)&local_d8);
          if (!bVar3) {
            return false;
          }
          Reflection::AddFloat(this_00,message,field,(float)local_d8.as_tree.cordz_info._0_4_);
        }
        break;
      case '\x03':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,(int64_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,local_d8.as_tree.cordz_info);
        }
        break;
      case '\x04':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = io::CodedInputStream::ReadVarint64(input,(uint64_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddUInt64(this_00,message,field,local_d8.as_tree.cordz_info);
        }
        break;
      case '\x05':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                            (input,(int32_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
        }
        break;
      case '\x06':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = io::CodedInputStream::ReadLittleEndian64(input,(uint64_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddUInt64(this_00,message,field,local_d8.as_tree.cordz_info);
        }
        break;
      case '\a':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = io::CodedInputStream::ReadLittleEndian32(input,(uint32_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddUInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
        }
        break;
      case '\b':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,(bool *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddBool(this_00,message,field,(bool)local_d8.data[0]);
        }
        break;
      case '\t':
      case '\n':
      case '\v':
      case '\f':
        return false;
      case '\r':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddUInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
        }
        break;
      case '\x0e':
        local_b8 = limit;
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                            (input,(int *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          bVar3 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
          if (bVar3) {
            this = FieldDescriptor::enum_type(field);
            value_00 = EnumDescriptor::FindValueByNumber(this,local_d8.as_tree.cordz_info._0_4_);
            if (value_00 == (EnumValueDescriptor *)0x0) {
              value_01 = (uint64_t)(int)local_d8.as_tree.cordz_info._0_4_;
              pUVar7 = Reflection::MutableUnknownFields(this_00,message);
              limit = local_b8;
              UnknownFieldSet::AddVarint(pUVar7,tag >> 3,value_01);
            }
            else {
              Reflection::AddEnum(this_00,message,field,value_00);
            }
          }
          else {
            Reflection::AddEnumValue(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
          }
        }
        break;
      case '\x0f':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                            (input,(int32_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
        }
        break;
      case '\x10':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                            (input,(int64_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,local_d8.as_tree.cordz_info);
        }
        break;
      case '\x11':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                            (input,(int32_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
        }
        break;
      case '\x12':
        while (iVar6 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar6) {
          bVar3 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                            (input,(int64_t *)local_d8.data);
          if (!bVar3) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,local_d8.as_tree.cordz_info);
        }
      }
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    goto LAB_0022d212;
  }
  switch(field->type_) {
  case '\x01':
    bVar3 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (input,(double *)&local_d8);
    if (!bVar3) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddDouble(this_00,message,field,(double)local_d8.as_tree.cordz_info);
    }
    else {
      Reflection::SetDouble(this_00,message,field,(double)local_d8.as_tree.cordz_info);
    }
    break;
  case '\x02':
    bVar3 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,(float *)&local_d8);
    if (!bVar3) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddFloat(this_00,message,field,(float)local_d8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,(float)local_d8.as_tree.cordz_info._0_4_);
    }
    break;
  case '\x03':
    bVar3 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                      (input,(int64_t *)local_d8.data);
    goto LAB_0022d3c1;
  case '\x04':
    bVar3 = io::CodedInputStream::ReadVarint64(input,(uint64_t *)local_d8.data);
    goto LAB_0022d3fb;
  case '\x05':
    bVar3 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (input,(int32_t *)local_d8.data);
    goto LAB_0022d2a9;
  case '\x06':
    bVar3 = io::CodedInputStream::ReadLittleEndian64(input,(uint64_t *)local_d8.data);
LAB_0022d3fb:
    if (bVar3 == false) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddUInt64(this_00,message,field,local_d8.as_tree.cordz_info);
      return true;
    }
    Reflection::SetUInt64(this_00,message,field,local_d8.as_tree.cordz_info);
    return true;
  case '\a':
    bVar3 = io::CodedInputStream::ReadLittleEndian32(input,(uint32_t *)local_d8.data);
    goto LAB_0022d46e;
  case '\b':
    bVar3 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      (input,(bool *)local_d8.data);
    if (!bVar3) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddBool(this_00,message,field,(bool)local_d8.data[0]);
    }
    else {
      Reflection::SetBool(this_00,message,field,(bool)local_d8.data[0]);
    }
    break;
  case '\t':
    bVar3 = FieldDescriptor::requires_utf8_validation(field);
    local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
    local_d8.as_tree.rep = (CordRep *)0x0;
    local_c8._M_local_buf[0] = '\0';
    bVar4 = WireFormatLite::ReadBytes(input,(string *)&local_d8.as_tree);
    if (!bVar4) {
LAB_0022d58f:
      std::__cxx11::string::~string((string *)&local_d8.as_tree);
      return false;
    }
    pcVar2 = (field->all_names_).payload_;
    uVar1 = *(ushort *)(pcVar2 + 2);
    field_name._M_len = pcVar2 + ~(ulong)uVar1;
    if (bVar3) {
      field_name._M_str = in_R9;
      bVar3 = WireFormatLite::VerifyUtf8String
                        ((WireFormatLite *)local_d8.as_tree.cordz_info,
                         (char *)((ulong)local_d8.as_tree.rep & 0xffffffff),0,(uint)uVar1,field_name
                        );
      if (!bVar3) goto LAB_0022d58f;
    }
    else {
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)field_name._M_len;
      WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)local_d8.as_tree.cordz_info,
                 (char *)((ulong)local_d8.as_tree.rep & 0xffffffff),0,(uint)uVar1,field_name_00);
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      value_02 = &local_50;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8.as_tree);
      Reflection::AddString(this_00,message,field,value_02);
    }
    else {
      value_02 = &local_70;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8.as_tree);
      Reflection::SetString(this_00,message,field,value_02);
    }
    goto LAB_0022d9e5;
  case '\n':
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      pMVar8 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar8 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar3 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar8);
    goto LAB_0022d5d6;
  case '\v':
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      pMVar8 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar8 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar3 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar8);
LAB_0022d5d6:
    if (bVar3 == false) {
      return false;
    }
    return true;
  case '\f':
    CVar5 = FieldDescriptor::cpp_string_type(field);
    if (CVar5 == kCord) {
      local_d8.as_tree.cordz_info = 0;
      local_d8.as_tree.rep = (CordRep *)0x0;
      bVar3 = WireFormatLite::ReadBytes(input,(Cord *)&local_d8.as_tree);
      if (bVar3) {
        Reflection::SetString(this_00,message,field,(Cord *)&local_d8.as_tree);
        absl::lts_20250127::Cord::~Cord((Cord *)&local_d8.as_tree);
        return true;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_d8.as_tree);
      return false;
    }
    local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
    local_d8.as_tree.rep = (CordRep *)0x0;
    local_c8._M_local_buf[0] = '\0';
    bVar3 = WireFormatLite::ReadBytes(input,(string *)&local_d8.as_tree);
    if (!bVar3) goto LAB_0022d58f;
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      value_02 = &local_90;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8.as_tree);
      Reflection::AddString(this_00,message,field,value_02);
    }
    else {
      value_02 = &local_b0;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8.as_tree);
      Reflection::SetString(this_00,message,field,value_02);
    }
LAB_0022d9e5:
    std::__cxx11::string::~string((string *)value_02);
    std::__cxx11::string::~string((string *)&local_d8.as_tree);
    break;
  case '\r':
    bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)local_d8.data);
LAB_0022d46e:
    if (bVar3 == false) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddUInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
      return true;
    }
    Reflection::SetUInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    return true;
  case '\x0e':
    bVar3 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      (input,(int *)local_d8.data);
    if (!bVar3) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddEnumValue(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    }
    break;
  case '\x0f':
    bVar3 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      (input,(int32_t *)local_d8.data);
    goto LAB_0022d2a9;
  case '\x10':
    bVar3 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      (input,(int64_t *)local_d8.data);
    goto LAB_0022d3c1;
  case '\x11':
    bVar3 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      (input,(int32_t *)local_d8.data);
LAB_0022d2a9:
    if (bVar3 == false) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
      return true;
    }
    Reflection::SetInt32(this_00,message,field,local_d8.as_tree.cordz_info._0_4_);
    return true;
  case '\x12':
    bVar3 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      (input,(int64_t *)local_d8.data);
LAB_0022d3c1:
    if (bVar3 == false) {
      return false;
    }
    bVar3 = FieldDescriptor::is_repeated(field);
    if (bVar3) {
      Reflection::AddInt64(this_00,message,field,local_d8.as_tree.cordz_info);
    }
    else {
      Reflection::SetInt64(this_00,message,field,local_d8.as_tree.cordz_info);
    }
  }
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32_t tag,
    const FieldDescriptor* field,  // May be nullptr for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == nullptr) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32_t length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (!field->legacy_enum_field_treated_as_closed()) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != nullptr) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64_t sign_extended_value = static_cast<int64_t>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32_t, Int32)
      HANDLE_TYPE(INT64, int64_t, Int64)
      HANDLE_TYPE(SINT32, int32_t, Int32)
      HANDLE_TYPE(SINT64, int64_t, Int64)
      HANDLE_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value;
          if (!WireFormatLite::ReadBytes(input, &value)) return false;
          message_reflection->SetString(message, field, value);
          break;
        }
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}